

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::cmGeneratorTarget(cmGeneratorTarget *this,cmTarget *t,cmLocalGenerator *lg)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGlobalGenerator *pcVar3;
  cmTarget *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  _WordT _Var11;
  _WordT _Var12;
  _WordT _Var13;
  _WordT _Var14;
  _WordT _Var15;
  cmMakefile *pcVar16;
  PolicyMap *pPVar17;
  cmValue cVar18;
  cmBTStringRange cVar19;
  string local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  TargetPropertyEntryVector *local_120;
  TargetPropertyEntryVector *local_118;
  TargetPropertyEntryVector *local_110;
  TargetPropertyEntryVector *local_108;
  TargetPropertyEntryVector *local_100;
  TargetPropertyEntryVector *local_f8;
  
  this->Target = t;
  local_128 = &(this->ObjectDirectory).field_2;
  (this->ObjectDirectory)._M_dataplus._M_p = (pointer)local_128;
  (this->ObjectDirectory)._M_string_length = 0;
  (this->ObjectDirectory).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->FortranModuleDirectoryCreated = false;
  local_130 = &(this->FortranModuleDirectory).field_2;
  (this->FortranModuleDirectory)._M_dataplus._M_p = (pointer)local_130;
  (this->FortranModuleDirectory)._M_string_length = 0;
  (this->FortranModuleDirectory).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->SourceDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Objects)._M_t._M_impl.super__Rb_tree_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_buckets =
       &(this->MacOSXRpathInstallNameDirCache)._M_h._M_single_bucket;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_bucket_count = 1;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_element_count = 0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138 = &(this->ExportMacro).field_2;
  (this->ExportMacro)._M_dataplus._M_p = (pointer)local_138;
  (this->ExportMacro)._M_string_length = 0;
  (this->ExportMacro).field_2._M_local_buf[0] = '\0';
  this->SourceFileFlagsConstructed = false;
  p_Var1 = &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140 = &(this->LinkerLanguage).field_2;
  (this->LinkerLanguage)._M_dataplus._M_p = (pointer)local_140;
  (this->LinkerLanguage)._M_string_length = 0;
  (this->LinkerLanguage).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->DeviceLink = false;
  p_Var1 = &(this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  p_Var1 = &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AllConfigSources).
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AllConfigSources).
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->AllConfigSources).
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MaybeInterfacePropertyExists)._M_h._M_buckets =
       &(this->MaybeInterfacePropertyExists)._M_h._M_single_bucket;
  (this->MaybeInterfacePropertyExists)._M_h._M_bucket_count = 1;
  (this->MaybeInterfacePropertyExists)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->MaybeInterfacePropertyExists)._M_h._M_element_count = 0;
  (this->MaybeInterfacePropertyExists)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_f8 = &this->CompileFeaturesEntries;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_100 = &this->CompileDefinitionsEntries;
  local_108 = &this->LinkOptionsEntries;
  local_110 = &this->LinkDirectoriesEntries;
  local_118 = &this->PrecompileHeadersEntries;
  local_120 = &this->SourceEntries;
  p_Var1 = &(this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header;
  memset(&(this->MaybeInterfacePropertyExists)._M_h._M_rehash_policy._M_next_resize,0,0xd0);
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchHeaders)._M_t._M_impl.super__Rb_tree_header;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchSources)._M_t._M_impl.super__Rb_tree_header;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->UnityBatchedSourceFiles)._M_h._M_buckets =
       &(this->UnityBatchedSourceFiles)._M_h._M_single_bucket;
  (this->UnityBatchedSourceFiles)._M_h._M_bucket_count = 1;
  (this->UnityBatchedSourceFiles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->UnityBatchedSourceFiles)._M_h._M_element_count = 0;
  (this->UnityBatchedSourceFiles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->UnityBatchedSourceFiles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->UnityBatchedSourceFiles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ISPCGeneratedHeaders)._M_h._M_buckets = &(this->ISPCGeneratedHeaders)._M_h._M_single_bucket
  ;
  (this->ISPCGeneratedHeaders)._M_h._M_bucket_count = 1;
  (this->ISPCGeneratedHeaders)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ISPCGeneratedHeaders)._M_h._M_element_count = 0;
  (this->ISPCGeneratedHeaders)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ISPCGeneratedHeaders)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ISPCGeneratedHeaders)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ISPCGeneratedObjects)._M_h._M_buckets = &(this->ISPCGeneratedObjects)._M_h._M_single_bucket
  ;
  (this->ISPCGeneratedObjects)._M_h._M_bucket_count = 1;
  (this->ISPCGeneratedObjects)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ISPCGeneratedObjects)._M_h._M_element_count = 0;
  (this->ISPCGeneratedObjects)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ISPCGeneratedObjects)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ISPCGeneratedObjects)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UtilityItems)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 0x33) = 0;
  this->DebugCompileOptionsDone = false;
  this->DebugCompileFeaturesDone = false;
  this->DebugCompileDefinitionsDone = false;
  this->DebugLinkOptionsDone = false;
  this->DebugLinkDirectoriesDone = false;
  this->DebugPrecompileHeadersDone = false;
  this->DebugSourcesDone = false;
  this->UtilityItemsDone = false;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[5] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[6] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[4] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[2] = 0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[0] = 0;
  this->SourcesAreContextDependent = Indeterminate;
  p_Var1 = &(this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar16 = cmTarget::GetMakefile(this->Target);
  this->Makefile = pcVar16;
  this->LocalGenerator = lg;
  pcVar3 = lg->GlobalGenerator;
  this->GlobalGenerator = pcVar3;
  (*pcVar3->_vptr_cmGlobalGenerator[0x37])(pcVar3,this);
  cVar19 = cmTarget::GetIncludeDirectoriesEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,&this->IncludeDirectoriesEntries,false);
  cVar19 = cmTarget::GetCompileOptionsEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,&this->CompileOptionsEntries,false);
  cVar19 = cmTarget::GetCompileFeaturesEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,local_f8,false);
  cVar19 = cmTarget::GetCompileDefinitionsEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,local_100,false);
  cVar19 = cmTarget::GetLinkOptionsEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,local_108,false);
  cVar19 = cmTarget::GetLinkDirectoriesEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,local_110,false);
  cVar19 = cmTarget::GetPrecompileHeadersEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,local_118,false);
  cVar19 = cmTarget::GetSourceEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar19,local_120,true);
  pPVar17 = cmTarget::GetPolicyMap(t);
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[6] =
       (pPVar17->Status).super__Base_bitset<7UL>._M_w[6];
  _Var11 = (pPVar17->Status).super__Base_bitset<7UL>._M_w[0];
  uVar5 = *(undefined4 *)((long)(pPVar17->Status).super__Base_bitset<7UL>._M_w + 4);
  _Var12 = (pPVar17->Status).super__Base_bitset<7UL>._M_w[1];
  uVar6 = *(undefined4 *)((long)(pPVar17->Status).super__Base_bitset<7UL>._M_w + 0xc);
  _Var13 = (pPVar17->Status).super__Base_bitset<7UL>._M_w[2];
  uVar7 = *(undefined4 *)((long)(pPVar17->Status).super__Base_bitset<7UL>._M_w + 0x14);
  _Var14 = (pPVar17->Status).super__Base_bitset<7UL>._M_w[3];
  uVar8 = *(undefined4 *)((long)(pPVar17->Status).super__Base_bitset<7UL>._M_w + 0x1c);
  uVar9 = *(undefined4 *)((long)(pPVar17->Status).super__Base_bitset<7UL>._M_w + 0x24);
  _Var15 = (pPVar17->Status).super__Base_bitset<7UL>._M_w[5];
  uVar10 = *(undefined4 *)((long)(pPVar17->Status).super__Base_bitset<7UL>._M_w + 0x2c);
  *(int *)((this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 4) =
       (int)(pPVar17->Status).super__Base_bitset<7UL>._M_w[4];
  *(undefined4 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 0x24) = uVar9;
  *(int *)((this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 5) = (int)_Var15;
  *(undefined4 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 0x2c) = uVar10;
  *(int *)((this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 2) = (int)_Var13;
  *(undefined4 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 0x14) = uVar7;
  *(int *)((this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 3) = (int)_Var14;
  *(undefined4 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 0x1c) = uVar8;
  *(int *)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w = (int)_Var11;
  *(undefined4 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 4) = uVar5;
  *(int *)((this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 1) = (int)_Var12;
  *(undefined4 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 0xc) = uVar6;
  pcVar4 = this->Target;
  paVar2 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"HAS_CXX","");
  cVar18 = cmTarget::GetProperty(pcVar4,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (cVar18.Value == (string *)0x0) {
    pcVar4 = this->Target;
    local_160._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"LINKER_LANGUAGE","");
    cmTarget::GetSafeProperty(pcVar4,&local_160);
    std::__cxx11::string::_M_assign((string *)&this->LinkerLanguage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->LinkerLanguage,0,(char *)(this->LinkerLanguage)._M_string_length,
               0x694c9e);
  }
  return;
}

Assistant:

cmGeneratorTarget::cmGeneratorTarget(cmTarget* t, cmLocalGenerator* lg)
  : Target(t)
{
  this->Makefile = this->Target->GetMakefile();
  this->LocalGenerator = lg;
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();

  this->GlobalGenerator->ComputeTargetObjectDirectory(this);

  CreatePropertyGeneratorExpressions(t->GetIncludeDirectoriesEntries(),
                                     this->IncludeDirectoriesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileOptionsEntries(),
                                     this->CompileOptionsEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileFeaturesEntries(),
                                     this->CompileFeaturesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileDefinitionsEntries(),
                                     this->CompileDefinitionsEntries);

  CreatePropertyGeneratorExpressions(t->GetLinkOptionsEntries(),
                                     this->LinkOptionsEntries);

  CreatePropertyGeneratorExpressions(t->GetLinkDirectoriesEntries(),
                                     this->LinkDirectoriesEntries);

  CreatePropertyGeneratorExpressions(t->GetPrecompileHeadersEntries(),
                                     this->PrecompileHeadersEntries);

  CreatePropertyGeneratorExpressions(t->GetSourceEntries(),
                                     this->SourceEntries, true);

  this->PolicyMap = t->GetPolicyMap();

  // Get hard-coded linker language
  if (this->Target->GetProperty("HAS_CXX")) {
    this->LinkerLanguage = "CXX";
  } else {
    this->LinkerLanguage = this->Target->GetSafeProperty("LINKER_LANGUAGE");
  }
}